

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O3

wchar_t uriParseSingleUriExMmA
                  (UriUriA *uri,char *first,char *afterLast,char **errorPos,UriMemoryManager *memory
                  )

{
  UriBool UVar1;
  wchar_t wVar2;
  UriParserStateA_conflict state;
  UriParserStateA_conflict local_50;
  
  wVar2 = L'\x02';
  if (afterLast != (char *)0x0 && (first != (char *)0x0 && uri != (UriUriA *)0x0)) {
    if (memory == (UriMemoryManager *)0x0) {
      memory = &defaultMemoryManager;
    }
    else {
      UVar1 = uriMemoryManagerIsComplete(memory);
      if (UVar1 != 1) {
        return L'\n';
      }
    }
    local_50.uri = uri;
    wVar2 = uriParseUriExMmA(&local_50,first,afterLast,memory);
    if (wVar2 == L'\0') {
      wVar2 = L'\0';
    }
    else {
      if (errorPos != (char **)0x0) {
        *errorPos = local_50.errorPos;
      }
      uriFreeUriMembersMmA(uri,memory);
    }
  }
  return wVar2;
}

Assistant:

int URI_FUNC(ParseSingleUriExMm)(URI_TYPE(Uri) * uri,
		const URI_CHAR * first, const URI_CHAR * afterLast,
		const URI_CHAR ** errorPos, UriMemoryManager * memory) {
	URI_TYPE(ParserState) state;
	int res;

	/* Check params */
	if ((uri == NULL) || (first == NULL) || (afterLast == NULL)) {
		return URI_ERROR_NULL;
	}
	URI_CHECK_MEMORY_MANAGER(memory);  /* may return */

	state.uri = uri;

	res = URI_FUNC(ParseUriExMm)(&state, first, afterLast, memory);

	if (res != URI_SUCCESS) {
		if (errorPos != NULL) {
			*errorPos = state.errorPos;
		}
		URI_FUNC(FreeUriMembersMm)(uri, memory);
	}

	return res;
}